

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

sqlite3_int64 integerValue(char *zArg)

{
  bool bVar1;
  int iVar2;
  byte *in_RDI;
  int x;
  int isNeg;
  int i;
  sqlite3_int64 v;
  char *in_stack_ffffffffffffffd8;
  int local_14;
  long local_10;
  byte *local_8;
  
  local_10 = 0;
  bVar1 = false;
  if (*in_RDI == 0x2d) {
    bVar1 = true;
    local_8 = in_RDI + 1;
  }
  else {
    local_8 = in_RDI;
    if (*in_RDI == 0x2b) {
      local_8 = in_RDI + 1;
    }
  }
  if ((*local_8 == 0x30) && (local_8[1] == 0x78)) {
    local_8 = local_8 + 2;
    while (iVar2 = hexDigitValue(*local_8), -1 < iVar2) {
      local_10 = local_10 * 0x10 + (long)iVar2;
      local_8 = local_8 + 1;
    }
  }
  else {
    while (iVar2 = isdigit((uint)*local_8), iVar2 != 0) {
      local_10 = local_10 * 10 + (long)(char)*local_8 + -0x30;
      local_8 = local_8 + 1;
    }
  }
  local_14 = 0;
  do {
    if (8 < local_14) {
LAB_001dd68b:
      if (bVar1) {
        local_10 = -local_10;
      }
      return local_10;
    }
    iVar2 = duckdb_shell_sqlite3_stricmp(in_stack_ffffffffffffffd8,(char *)0x1dd653);
    if (iVar2 == 0) {
      local_10 = integerValue::aMult[local_14].iMult * local_10;
      goto LAB_001dd68b;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static sqlite3_int64 integerValue(const char *zArg) {
	sqlite3_int64 v = 0;
	static const struct {
		const char *zSuffix;
		int iMult;
	} aMult[] = {
	    {"KiB", 1024}, {"MiB", 1024 * 1024}, {"GiB", 1024 * 1024 * 1024},
	    {"KB", 1000},  {"MB", 1000000},      {"GB", 1000000000},
	    {"K", 1000},   {"M", 1000000},       {"G", 1000000000},
	};
	int i;
	int isNeg = 0;
	if (zArg[0] == '-') {
		isNeg = 1;
		zArg++;
	} else if (zArg[0] == '+') {
		zArg++;
	}
	if (zArg[0] == '0' && zArg[1] == 'x') {
		int x;
		zArg += 2;
		while ((x = hexDigitValue(zArg[0])) >= 0) {
			v = (v << 4) + x;
			zArg++;
		}
	} else {
		while (IsDigit(zArg[0])) {
			v = v * 10 + zArg[0] - '0';
			zArg++;
		}
	}
	for (i = 0; i < ArraySize(aMult); i++) {
		if (sqlite3_stricmp(aMult[i].zSuffix, zArg) == 0) {
			v *= aMult[i].iMult;
			break;
		}
	}
	return isNeg ? -v : v;
}